

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall
edition_unittest::TestNestedMessageHasBits::~TestNestedMessageHasBits
          (TestNestedMessageHasBits *this)

{
  ~TestNestedMessageHasBits(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestNestedMessageHasBits::~TestNestedMessageHasBits() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestNestedMessageHasBits)
  SharedDtor(*this);
}